

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::HasAllDesirableServiceFlags
          (PeerManagerImpl *this,ServiceFlags services)

{
  long lVar1;
  ServiceFlags SVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = GetDesirableServiceFlags(this,services);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (SVar2 & ~services) == NODE_NONE;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::HasAllDesirableServiceFlags(ServiceFlags services) const
{
    // Shortcut for (services & GetDesirableServiceFlags(services)) == GetDesirableServiceFlags(services)
    return !(GetDesirableServiceFlags(services) & (~services));
}